

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O2

void __thiscall asl::Var::operator=(Var *this,char *x)

{
  int iVar1;
  size_t sVar2;
  char *__ptr;
  anon_union_8_8_7df20137_for_Var_3 __dest;
  Array<char> local_30;
  
  __ptr = x;
  sVar2 = strlen(x);
  iVar1 = (int)sVar2;
  if (this->_type == STRING) {
    Array<char>::resize((Array<char> *)&(this->field_1)._a,iVar1 + 1);
    __dest = this->field_1;
  }
  else {
    if (7 < iVar1 || this->_type != SSTRING) {
      free(this,__ptr);
      if (7 < iVar1) {
        this->_type = STRING;
        Array<char>::alloc(&local_30,iVar1 + 1U);
        (this->field_1)._l = (Long)local_30._a;
        LOCK();
        *(int *)(local_30._a + -8) = *(int *)(local_30._a + -8) + 1;
        UNLOCK();
        Array<char>::~Array(&local_30);
        memcpy((void *)this->field_1,x,(ulong)(iVar1 + 1U));
        return;
      }
      this->_type = SSTRING;
    }
    __dest._l = (Long)&this->field_1;
  }
  memcpy((void *)__dest,x,(long)(iVar1 + 1));
  return;
}

Assistant:

void Var::operator=(const char* x)
{
	int n = (int)strlen(x);
	if (_type == STRING) {
		_s->resize(n + 1);
		memcpy(_s->data(), x, n + 1);
	}
	else if(_type==SSTRING && n < VAR_SSPACE)
		memcpy(_ss, x, n + 1);
	else
	{
		free();
		if(n < VAR_SSPACE)
		{
			_type = SSTRING;
			memcpy(_ss, x, n + 1);
		}
		else
		{
			_type=STRING;
			NEW_STRINGC(_s, n + 1);
			memcpy(_s->data(), x, n + 1);
		}
	}
}